

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cord_rep_btree_navigator.h
# Opt level: O3

CordRep * __thiscall
absl::lts_20240722::cord_internal::CordRepBtreeNavigator::
Init<(absl::lts_20240722::cord_internal::CordRepBtree::EdgeType)0>
          (CordRepBtreeNavigator *this,CordRepBtree *tree)

{
  CordRepBtree *pCVar1;
  ulong uVar2;
  ulong uVar3;
  byte bVar4;
  byte bVar5;
  
  if (tree == (CordRepBtree *)0x0) {
    __assert_fail("tree != nullptr",
                  "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_abseil/build_O3/_deps/absl-src/absl/strings/internal/cord_rep_btree_navigator.h"
                  ,0xae,
                  "CordRep *absl::cord_internal::CordRepBtreeNavigator::Init(CordRepBtree *) [edge_type = absl::cord_internal::CordRepBtree::EdgeType::kFront]"
                 );
  }
  if ((tree->super_CordRep).storage[2] == (tree->super_CordRep).storage[1]) {
    __assert_fail("tree->size() > 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_abseil/build_O3/_deps/absl-src/absl/strings/internal/cord_rep_btree_navigator.h"
                  ,0xaf,
                  "CordRep *absl::cord_internal::CordRepBtreeNavigator::Init(CordRepBtree *) [edge_type = absl::cord_internal::CordRepBtree::EdgeType::kFront]"
                 );
  }
  bVar4 = (tree->super_CordRep).storage[0];
  uVar3 = (ulong)bVar4;
  if (0xb < bVar4) {
    __assert_fail("tree->height() <= CordRepBtree::kMaxHeight",
                  "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_abseil/build_O3/_deps/absl-src/absl/strings/internal/cord_rep_btree_navigator.h"
                  ,0xb0,
                  "CordRep *absl::cord_internal::CordRepBtreeNavigator::Init(CordRepBtree *) [edge_type = absl::cord_internal::CordRepBtree::EdgeType::kFront]"
                 );
  }
  this->height_ = (uint)bVar4;
  bVar5 = (tree->super_CordRep).storage[1];
  this->node_[uVar3] = tree;
  this->index_[uVar3] = bVar5;
  uVar2 = (ulong)bVar5;
  if (bVar4 != 0) {
    uVar3 = uVar3 + 1;
    bVar4 = (tree->super_CordRep).storage[1];
    do {
      if (bVar5 < bVar4) goto LAB_001112dd;
      if ((tree->super_CordRep).storage[2] <= bVar5) goto LAB_001112fc;
      tree = (CordRepBtree *)tree->edges_[uVar2];
      if ((tree->super_CordRep).tag != '\x03') {
        __assert_fail("IsBtree()",
                      "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_abseil/build_O3/_deps/absl-src/absl/strings/internal/cord_rep_btree.h"
                      ,599,"CordRepBtree *absl::cord_internal::CordRep::btree()");
      }
      *(CordRepBtree **)(this->index_ + uVar3 * 8 + -4) = tree;
      bVar5 = (tree->super_CordRep).storage[1];
      this->index_[uVar3 - 2] = bVar5;
      uVar2 = (ulong)bVar5;
      uVar3 = uVar3 - 1;
      bVar4 = bVar5;
    } while (1 < uVar3);
  }
  pCVar1 = this->node_[0];
  if ((pCVar1->super_CordRep).storage[1] <= bVar5) {
    if (bVar5 < (pCVar1->super_CordRep).storage[2]) {
      return pCVar1->edges_[uVar2];
    }
LAB_001112fc:
    __assert_fail("index < end()",
                  "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_abseil/build_O3/_deps/absl-src/absl/strings/internal/cord_rep_btree.h"
                  ,0x269,"CordRep *absl::cord_internal::CordRepBtree::Edge(size_t) const");
  }
LAB_001112dd:
  __assert_fail("index >= begin()",
                "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_abseil/build_O3/_deps/absl-src/absl/strings/internal/cord_rep_btree.h"
                ,0x268,"CordRep *absl::cord_internal::CordRepBtree::Edge(size_t) const");
}

Assistant:

inline CordRep* CordRepBtreeNavigator::Init(CordRepBtree* tree) {
  assert(tree != nullptr);
  assert(tree->size() > 0);
  assert(tree->height() <= CordRepBtree::kMaxHeight);
  int height = height_ = tree->height();
  size_t index = tree->index(edge_type);
  node_[height] = tree;
  index_[height] = static_cast<uint8_t>(index);
  while (--height >= 0) {
    tree = tree->Edge(index)->btree();
    node_[height] = tree;
    index = tree->index(edge_type);
    index_[height] = static_cast<uint8_t>(index);
  }
  return node_[0]->Edge(index);
}